

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

size_t __thiscall CCoinsViewCache::DynamicMemoryUsage(CCoinsViewCache *this)

{
  PoolResource<144UL,_8UL> *pPVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  pPVar1 = (this->cacheCoins)._M_h.
           super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>_>
           .
           super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>,_false>
           ._M_tp.m_resource;
  uVar2 = (this->cacheCoins)._M_h._M_bucket_count;
  sVar3 = pPVar1->m_chunk_size_bytes;
  lVar5 = 0x30;
  if (sVar3 != 0) {
    lVar5 = (sVar3 + 0x1f & 0xfffffffffffffff0) + 0x30;
  }
  uVar4 = uVar2 * 8 + 0x1f & 0xfffffffffffffff0;
  if ((uVar2 & 0x1fffffffffffffff) == 0) {
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar4 + this->cachedCoinsUsage +
           lVar5 * (pPVar1->m_allocated_chunks).
                   super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl._M_node.
                   _M_size;
  }
  __stack_chk_fail();
}

Assistant:

size_t CCoinsViewCache::DynamicMemoryUsage() const {
    return memusage::DynamicUsage(cacheCoins) + cachedCoinsUsage;
}